

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib2plus.hpp
# Opt level: O2

void __thiscall
trng::lagfib2plus<unsigned_int,_168U,_521U>::seed<trng::minstd>
          (lagfib2plus<unsigned_int,_168U,_521U> *this,minstd *g)

{
  result_type rVar1;
  result_type_conflict rVar2;
  int iVar3;
  uint i;
  long lVar4;
  bool bVar5;
  
  for (lVar4 = 0; lVar4 != 0x209; lVar4 = lVar4 + 1) {
    rVar2 = 0;
    iVar3 = 0x20;
    while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
      rVar1 = minstd::operator()(g);
      rVar2 = (uint)(rVar1 + 0xbfffffff < 0xc0000000) + rVar2 * 2;
    }
    (this->S).r[lVar4] = rVar2;
  }
  (this->S).index = 0x208;
  return;
}

Assistant:

void seed(gen &g) {
      for (unsigned int i{0}; i < B; ++i) {
        result_type r{0};
        for (int j{0}; j < std::numeric_limits<result_type>::digits; ++j) {
          r <<= 1;
          if (g() - gen::min() > gen::max() / 2)
            ++r;
        }
        S.r[i] = r;
      }
      S.index = B - 1;
    }